

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall SpiSimulationDataGenerator::CreateSpiTransaction(SpiSimulationDataGenerator *this)

{
  SpiSimulationDataGenerator *this_local;
  
  if (this->mEnable != (SimulationChannelDescriptor *)0x0) {
    SimulationChannelDescriptor::Transition();
  }
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x20);
  if (this->mSettings->mDataValidEdge == LeadingEdge) {
    OutputWord_CPHA0(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
    OutputWord_CPHA0(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
    OutputWord_CPHA0(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
    if (this->mEnable != (SimulationChannelDescriptor *)0x0) {
      SimulationChannelDescriptor::Transition();
    }
    OutputWord_CPHA0(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
  }
  else {
    OutputWord_CPHA1(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
    OutputWord_CPHA1(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
    OutputWord_CPHA1(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
    if (this->mEnable != (SimulationChannelDescriptor *)0x0) {
      SimulationChannelDescriptor::Transition();
    }
    OutputWord_CPHA1(this,this->mValue,this->mValue + 1);
    this->mValue = this->mValue + 1;
  }
  return;
}

Assistant:

void SpiSimulationDataGenerator::CreateSpiTransaction()
{
    if( mEnable != NULL )
        mEnable->Transition();

    mSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) );

    if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
    {
        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;

        if( mEnable != NULL )
            mEnable->Transition();

        OutputWord_CPHA0( mValue, mValue + 1 );
        mValue++;
    }
    else
    {
        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;

        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;

        if( mEnable != NULL )
            mEnable->Transition();

        OutputWord_CPHA1( mValue, mValue + 1 );
        mValue++;
    }
}